

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O2

void highbd_update_mask0(__m128i *qcoeff0,__m128i *qcoeff1,__m128i *threshold,int16_t *iscan_ptr,
                        int *is_found,__m128i *mask)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar10 [16];
  short sVar17;
  undefined1 auVar18 [16];
  
  auVar10._0_4_ = -(uint)((int)(*threshold)[0] < (int)(*qcoeff0)[0] << 5);
  auVar10._4_4_ = -(uint)(*(int *)((long)*threshold + 4) < *(int *)((long)*qcoeff0 + 4) << 5);
  auVar10._8_4_ = -(uint)((int)(*threshold)[1] < (int)(*qcoeff0)[1] << 5);
  auVar10._12_4_ = -(uint)(*(int *)((long)*threshold + 0xc) < *(int *)((long)*qcoeff0 + 0xc) << 5);
  auVar18._0_4_ = -(uint)((int)threshold[1][0] < (int)(*qcoeff1)[0] << 5);
  auVar18._4_4_ = -(uint)(*(int *)((long)threshold[1] + 4) < *(int *)((long)*qcoeff1 + 4) << 5);
  auVar18._8_4_ = -(uint)((int)threshold[1][1] < (int)(*qcoeff1)[1] << 5);
  auVar18._12_4_ = -(uint)(*(int *)((long)threshold[1] + 0xc) < *(int *)((long)*qcoeff1 + 0xc) << 5)
  ;
  auVar10 = packssdw(auVar10,auVar18);
  if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar10 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar10 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar10 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar10 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar10 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar10 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar10 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar10 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar10 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar10 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar10 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar10 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar10 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar10[0xf]) {
    auVar10 = (undefined1  [16])0x0;
  }
  else {
    auVar10 = auVar10 & *(undefined1 (*) [16])iscan_ptr;
    *is_found = 1;
  }
  sVar1 = (short)(*mask)[0];
  sVar2 = *(short *)((long)*mask + 2);
  sVar3 = *(short *)((long)*mask + 4);
  sVar4 = *(short *)((long)*mask + 6);
  sVar5 = (short)(*mask)[1];
  sVar6 = *(short *)((long)*mask + 10);
  sVar7 = *(short *)((long)*mask + 0xc);
  sVar8 = *(short *)((long)*mask + 0xe);
  sVar9 = auVar10._0_2_;
  sVar11 = auVar10._2_2_;
  sVar12 = auVar10._4_2_;
  sVar13 = auVar10._6_2_;
  sVar14 = auVar10._8_2_;
  sVar15 = auVar10._10_2_;
  sVar16 = auVar10._12_2_;
  sVar17 = auVar10._14_2_;
  *(ushort *)*mask = (ushort)(sVar9 < sVar1) * sVar1 | (ushort)(sVar9 >= sVar1) * sVar9;
  *(ushort *)((long)*mask + 2) =
       (ushort)(sVar11 < sVar2) * sVar2 | (ushort)(sVar11 >= sVar2) * sVar11;
  *(ushort *)((long)*mask + 4) =
       (ushort)(sVar12 < sVar3) * sVar3 | (ushort)(sVar12 >= sVar3) * sVar12;
  *(ushort *)((long)*mask + 6) =
       (ushort)(sVar13 < sVar4) * sVar4 | (ushort)(sVar13 >= sVar4) * sVar13;
  *(ushort *)(*mask + 1) = (ushort)(sVar14 < sVar5) * sVar5 | (ushort)(sVar14 >= sVar5) * sVar14;
  *(ushort *)((long)*mask + 10) =
       (ushort)(sVar15 < sVar6) * sVar6 | (ushort)(sVar15 >= sVar6) * sVar15;
  *(ushort *)((long)*mask + 0xc) =
       (ushort)(sVar16 < sVar7) * sVar7 | (ushort)(sVar16 >= sVar7) * sVar16;
  *(ushort *)((long)*mask + 0xe) =
       (ushort)(sVar17 < sVar8) * sVar8 | (ushort)(sVar17 >= sVar8) * sVar17;
  return;
}

Assistant:

static inline void highbd_update_mask0(__m128i *qcoeff0, __m128i *qcoeff1,
                                       __m128i *threshold,
                                       const int16_t *iscan_ptr, int *is_found,
                                       __m128i *mask) {
  __m128i coeff[2], cmp_mask0, cmp_mask1;

  coeff[0] = _mm_slli_epi32(*qcoeff0, AOM_QM_BITS);
  cmp_mask0 = _mm_cmpgt_epi32(coeff[0], threshold[0]);
  coeff[1] = _mm_slli_epi32(*qcoeff1, AOM_QM_BITS);
  cmp_mask1 = _mm_cmpgt_epi32(coeff[1], threshold[1]);

  cmp_mask0 = _mm_packs_epi32(cmp_mask0, cmp_mask1);

  highbd_update_mask1(&cmp_mask0, iscan_ptr, is_found, mask);
}